

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void ChooseDistanceParams(BrotliEncoderParams *params)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  if (3 < params->quality) {
    if (params->mode == BROTLI_MODE_FONT) {
      uVar11 = 1;
      uVar5 = 0xc;
    }
    else {
      uVar11 = (params->dist).distance_postfix_bits;
      uVar5 = (params->dist).num_direct_distance_codes;
    }
    if ((uVar5 < 0x79 && uVar11 < 4) &&
       (bVar3 = (byte)uVar11, (uVar5 >> (bVar3 & 0x1f) & 0xf) << (bVar3 & 0x1f) == uVar5)) {
      (params->dist).distance_postfix_bits = uVar11;
      (params->dist).num_direct_distance_codes = uVar5;
      if (params->large_window == 0) {
        uVar11 = uVar5 + (0x18 << (bVar3 + 1 & 0x1f)) + 0x10;
        uVar7 = (ulong)uVar11;
        sVar9 = (size_t)((1 << (bVar3 + 0x1a & 0x1f)) + uVar5 + (-1 << (bVar3 + 2 & 0x1f)));
      }
      else {
        iVar10 = uVar5 + 0x10;
        if (uVar5 < 0x7ffffffc) {
          uVar6 = 0xffffffff;
          uVar12 = -1 << (bVar3 & 0x1f);
          uVar8 = (0x7ffffffc - uVar5 >> (bVar3 & 0x1f)) + 4;
          iVar4 = -5;
          uVar11 = uVar8;
          do {
            uVar6 = uVar6 + 1;
            iVar4 = iVar4 + 2;
            bVar1 = 3 < uVar11;
            uVar11 = uVar11 >> 1;
          } while (bVar1);
          uVar11 = (uint)((uVar8 >> (uVar6 & 0x1f) & 1) != 0) + iVar4;
          iVar4 = iVar10;
          if (uVar11 != 0xffffffff) {
            bVar2 = (byte)(uVar11 >> 1);
            iVar4 = uVar5 + (uVar11 << (bVar3 & 0x1f) | ~uVar12);
            uVar5 = (uVar5 - uVar12) +
                    ((6 << (bVar2 & 0x1f)) + ((uVar11 & 1) << (bVar2 + 1 & 0x1f)) + -5 <<
                    (bVar3 & 0x1f));
            iVar4 = iVar4 + 0x11;
          }
          uVar7 = CONCAT44(uVar5,iVar4);
        }
        else {
          uVar7 = 0x7ffffffc8000000c;
        }
        sVar9 = uVar7 >> 0x20;
        uVar11 = iVar10 + (0x3e << (bVar3 + 1 & 0x1f));
      }
      (params->dist).alphabet_size_max = uVar11;
      (params->dist).alphabet_size_limit = (uint32_t)uVar7;
      (params->dist).max_distance = sVar9;
      return;
    }
  }
  BrotliInitDistanceParams(params,0,0);
  return;
}

Assistant:

static void ChooseDistanceParams(BrotliEncoderParams* params) {
  uint32_t distance_postfix_bits = 0;
  uint32_t num_direct_distance_codes = 0;

  if (params->quality >= MIN_QUALITY_FOR_NONZERO_DISTANCE_PARAMS) {
    uint32_t ndirect_msb;
    if (params->mode == BROTLI_MODE_FONT) {
      distance_postfix_bits = 1;
      num_direct_distance_codes = 12;
    } else {
      distance_postfix_bits = params->dist.distance_postfix_bits;
      num_direct_distance_codes = params->dist.num_direct_distance_codes;
    }
    ndirect_msb = (num_direct_distance_codes >> distance_postfix_bits) & 0x0F;
    if (distance_postfix_bits > BROTLI_MAX_NPOSTFIX ||
        num_direct_distance_codes > BROTLI_MAX_NDIRECT ||
        (ndirect_msb << distance_postfix_bits) != num_direct_distance_codes) {
      distance_postfix_bits = 0;
      num_direct_distance_codes = 0;
    }
  }

  BrotliInitDistanceParams(
      params, distance_postfix_bits, num_direct_distance_codes);
}